

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

void __thiscall
CLPIParser::composeEP_map_for_one_stream_PID
          (CLPIParser *this,BitStreamWriter *writer,M2TSStreamInfo *streamInfo)

{
  uint uVar1;
  uint *puVar2;
  pointer pmVar3;
  size_t sVar4;
  bool bVar5;
  uint uVar6;
  uint32_t uVar7;
  _Base_ptr p_Var8;
  int iVar9;
  BluRayCoarseInfo *i;
  pointer pBVar10;
  vector<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_> coarseInfo;
  
  puVar2 = (writer->super_BitStream).m_initBuffer;
  iVar9 = (*(int *)&(writer->super_BitStream).m_buffer - (int)puVar2) * 8 + writer->m_bitWrited;
  BitStreamWriter::putBits(writer,0x20,0);
  buildCoarseInfo(&coarseInfo,this,streamInfo);
  for (pBVar10 = coarseInfo.super__Vector_base<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pBVar10 !=
      coarseInfo.super__Vector_base<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_>._M_impl.
      super__Vector_impl_data._M_finish; pBVar10 = pBVar10 + 1) {
    BitStreamWriter::putBits(writer,0x12,pBVar10->m_fineRefID);
    BitStreamWriter::putBits(writer,0xe,pBVar10->m_coarsePts);
    BitStreamWriter::putBits(writer,0x20,pBVar10->m_pktCnt);
  }
  uVar6 = (*(int *)&(writer->super_BitStream).m_buffer -
          *(int *)&(writer->super_BitStream).m_initBuffer) * 8 + writer->m_bitWrited;
  if ((uVar6 & 0xf) != 0) {
    BitStreamWriter::putBits(writer,8,0);
    uVar6 = (*(int *)&(writer->super_BitStream).m_buffer -
            *(int *)&(writer->super_BitStream).m_initBuffer) * 8 + writer->m_bitWrited;
  }
  uVar7 = my_ntohl(iVar9 / -8 + (int)uVar6 / 8);
  *(uint32_t *)((long)puVar2 + (long)(iVar9 / 8)) = uVar7;
  pmVar3 = (streamInfo->m_index).
           super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pmVar3 != (streamInfo->m_index).
                super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    sVar4 = this->m_clpiNum;
    for (p_Var8 = pmVar3[sVar4]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &pmVar3[sVar4]._M_t._M_impl.super__Rb_tree_header;
        p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8)) {
      BitStreamWriter::putBit(writer,0);
      if (*(int *)((long)&p_Var8[1]._M_parent + 4) == 0) {
        uVar6 = 0;
      }
      else {
        bVar5 = is4K();
        uVar1 = *(uint *)((long)&p_Var8[1]._M_parent + 4);
        uVar6 = 1;
        if (bVar5) {
          if (0xbffff < uVar1) {
            uVar6 = 2;
            if ((0x17ffff < uVar1) && (uVar6 = 3, 0x23ffff < uVar1)) {
              uVar6 = 4;
              if (0x2fffff < uVar1) {
                uVar6 = 5;
                if (0x3bffff < uVar1) {
                  bVar5 = uVar1 < 0x480000;
LAB_001e5206:
                  uVar6 = 7 - bVar5;
                }
              }
            }
          }
        }
        else if (0x1ffff < uVar1) {
          uVar6 = 2;
          if ((0x3ffff < uVar1) && (uVar6 = 3, 0x5ffff < uVar1)) {
            uVar6 = 4;
            if (0x8ffff < uVar1) {
              uVar6 = 5;
              if (0xdffff < uVar1) {
                bVar5 = uVar1 < 0x140000;
                goto LAB_001e5206;
              }
            }
          }
        }
      }
      BitStreamWriter::putBits(writer,3,uVar6);
      BitStreamWriter::putBits(writer,0xb,p_Var8[1]._M_color >> 9 & 0x7ff);
      BitStreamWriter::putBits(writer,0x11,*(uint *)&p_Var8[1]._M_parent & 0x1ffff);
    }
  }
  std::_Vector_base<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_>::~_Vector_base
            (&coarseInfo.super__Vector_base<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_>);
  return;
}

Assistant:

void CLPIParser::composeEP_map_for_one_stream_PID(BitStreamWriter& writer, M2TSStreamInfo& streamInfo) const
{
    const auto epFineStartAddr = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    const uint32_t beforePos = writer.getBitsCount() / 8;
    writer.putBits(32, 0);  // EP_fine_table_start_address
    const std::vector<BluRayCoarseInfo> coarseInfo = buildCoarseInfo(streamInfo);
    for (const auto& i : coarseInfo)
    {
        writer.putBits(18, i.m_fineRefID);  // ref_to_EP_fine_id[i]
        writer.putBits(14, i.m_coarsePts);  // PTS_EP_coarse[i]
        writer.putBits(32, i.m_pktCnt);     // SPN_EP_coarse[i]
    }
    if (writer.getBitsCount() % 16 != 0)
        writer.putBits(8, 0);  // padding_word
    *epFineStartAddr = my_htonl(writer.getBitsCount() / 8 - beforePos);
    if (!streamInfo.m_index.empty())
    {
        const PMTIndex& curIndex = streamInfo.m_index[m_clpiNum];
        for (const auto& [fst, snd] : curIndex)
        {
            const PMTIndexData& indexData = snd;
            writer.putBit(0);  // is_angle_change_point[EP_fine_id]
            int endCode = 0;
            if (indexData.m_frameLen > 0)
            {
                if (is4K())
                {
                    if (indexData.m_frameLen < 786432)
                        endCode = 1;
                    else if (indexData.m_frameLen < 1572864)
                        endCode = 2;
                    else if (indexData.m_frameLen < 2359296)
                        endCode = 3;
                    else if (indexData.m_frameLen < 3145728)
                        endCode = 4;
                    else if (indexData.m_frameLen < 3932160)
                        endCode = 5;
                    else if (indexData.m_frameLen < 4718592)
                        endCode = 6;
                    else
                        endCode = 7;
                }
                else
                {
                    if (indexData.m_frameLen < 131072)
                        endCode = 1;
                    else if (indexData.m_frameLen < 262144)
                        endCode = 2;
                    else if (indexData.m_frameLen < 393216)
                        endCode = 3;
                    else if (indexData.m_frameLen < 589824)
                        endCode = 4;
                    else if (indexData.m_frameLen < 917504)
                        endCode = 5;
                    else if (indexData.m_frameLen < 1310720)
                        endCode = 6;
                    else
                        endCode = 7;
                }
            }
            writer.putBits(3, endCode);                          // I_end_position_offset[EP_fine_id]
            writer.putBits(11, (fst >> 9) % (1 << 11));          // PTS_EP_fine[EP_fine_id]
            writer.putBits(17, indexData.m_pktCnt % (1 << 17));  // SPN_EP_fine[EP_fine_id]
        }
    }
}